

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O1

void chacha20_round(chacha20 *ctx)

{
  uint32_t *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88 [19];
  uint local_3c;
  chacha20 *local_38;
  
  local_88[4] = (uint)*(undefined8 *)(ctx->state + 4);
  local_88[5] = (uint)((ulong)*(undefined8 *)(ctx->state + 4) >> 0x20);
  local_88[0] = (uint)*(undefined8 *)ctx->state;
  local_88[1] = (uint)((ulong)*(undefined8 *)ctx->state >> 0x20);
  local_90 = local_88[1];
  local_88[0xc] = (uint)*(undefined8 *)(ctx->state + 0xc);
  local_88[0xd] = (uint)((ulong)*(undefined8 *)(ctx->state + 0xc) >> 0x20);
  local_88[8] = (uint)*(undefined8 *)(ctx->state + 8);
  local_88[9] = (uint)((ulong)*(undefined8 *)(ctx->state + 8) >> 0x20);
  local_94 = local_88[9];
  local_88[6] = (uint)*(undefined8 *)(ctx->state + 6);
  local_88[2] = (uint)*(undefined8 *)(ctx->state + 2);
  local_88[0xe] = (uint)*(undefined8 *)(ctx->state + 0xe);
  local_88[10] = (uint)*(undefined8 *)(ctx->state + 10);
  local_88[7] = (uint)((ulong)*(undefined8 *)(ctx->state + 6) >> 0x20);
  local_88[3] = (uint)((ulong)*(undefined8 *)(ctx->state + 2) >> 0x20);
  local_88[0xf] = (uint)((ulong)*(undefined8 *)(ctx->state + 0xe) >> 0x20);
  local_8c = 0xfffffffe;
  local_88[0xb] = (uint)((ulong)*(undefined8 *)(ctx->state + 10) >> 0x20);
  do {
    local_3c = local_88[2];
    local_88[0xc] = local_88[0xc] ^ local_88[0] + local_88[4];
    uVar3 = local_88[0xc] << 0x10 | local_88[0xc] >> 0x10;
    local_88[8] = local_88[8] + uVar3;
    uVar5 = local_88[4] ^ local_88[8];
    uVar5 = uVar5 << 0xc | uVar5 >> 0x14;
    local_88[0] = local_88[0] + local_88[4] + uVar5;
    uVar3 = uVar3 ^ local_88[0];
    uVar4 = uVar3 << 8 | uVar3 >> 0x18;
    local_88[8] = local_88[8] + uVar4;
    uVar5 = uVar5 ^ local_88[8];
    uVar6 = uVar5 << 7 | uVar5 >> 0x19;
    local_88[0xd] = local_88[0xd] ^ local_90 + local_88[5];
    uVar5 = local_88[0xd] << 0x10 | local_88[0xd] >> 0x10;
    local_94 = local_94 + uVar5;
    uVar3 = local_88[5] ^ local_94;
    uVar3 = uVar3 << 0xc | uVar3 >> 0x14;
    local_90 = local_90 + local_88[5] + uVar3;
    uVar5 = uVar5 ^ local_90;
    uVar5 = uVar5 << 8 | uVar5 >> 0x18;
    local_94 = local_94 + uVar5;
    uVar3 = uVar3 ^ local_94;
    uVar3 = uVar3 << 7 | uVar3 >> 0x19;
    local_88[0xe] = local_88[0xe] ^ local_3c + local_88[6];
    uVar8 = local_88[0xe] << 0x10 | local_88[0xe] >> 0x10;
    local_88[10] = local_88[10] + uVar8;
    uVar7 = local_88[6] ^ local_88[10];
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    local_88[2] = local_3c + local_88[6] + uVar7;
    uVar8 = uVar8 ^ local_88[2];
    uVar9 = uVar8 << 8 | uVar8 >> 0x18;
    local_88[10] = local_88[10] + uVar9;
    uVar7 = uVar7 ^ local_88[10];
    uVar8 = uVar7 << 7 | uVar7 >> 0x19;
    local_88[0xf] = local_88[0xf] ^ local_88[3] + local_88[7];
    uVar10 = local_88[0xf] << 0x10 | local_88[0xf] >> 0x10;
    local_88[0xb] = local_88[0xb] + uVar10;
    uVar7 = local_88[7] ^ local_88[0xb];
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    local_88[3] = local_88[3] + local_88[7] + uVar7;
    uVar10 = uVar10 ^ local_88[3];
    uVar10 = uVar10 << 8 | uVar10 >> 0x18;
    local_88[0xb] = local_88[0xb] + uVar10;
    uVar7 = uVar7 ^ local_88[0xb];
    uVar7 = uVar7 << 7 | uVar7 >> 0x19;
    local_88[0] = local_88[0] + uVar3;
    uVar10 = uVar10 ^ local_88[0];
    uVar10 = uVar10 << 0x10 | uVar10 >> 0x10;
    local_88[10] = local_88[10] + uVar10;
    uVar3 = uVar3 ^ local_88[10];
    uVar3 = uVar3 << 0xc | uVar3 >> 0x14;
    local_88[0] = local_88[0] + uVar3;
    uVar10 = uVar10 ^ local_88[0];
    local_88[0xf] = uVar10 << 8 | uVar10 >> 0x18;
    local_88[10] = local_88[10] + local_88[0xf];
    uVar3 = uVar3 ^ local_88[10];
    local_88[5] = uVar3 << 7 | uVar3 >> 0x19;
    local_90 = local_90 + uVar8;
    uVar4 = uVar4 ^ local_90;
    uVar3 = uVar4 << 0x10 | uVar4 >> 0x10;
    local_88[0xb] = local_88[0xb] + uVar3;
    uVar8 = uVar8 ^ local_88[0xb];
    uVar4 = uVar8 << 0xc | uVar8 >> 0x14;
    local_90 = local_90 + uVar4;
    uVar3 = uVar3 ^ local_90;
    local_88[0xc] = uVar3 << 8 | uVar3 >> 0x18;
    local_88[0xb] = local_88[0xb] + local_88[0xc];
    uVar4 = uVar4 ^ local_88[0xb];
    local_88[6] = uVar4 << 7 | uVar4 >> 0x19;
    local_88[2] = local_88[2] + uVar7;
    uVar5 = uVar5 ^ local_88[2];
    uVar3 = uVar5 << 0x10 | uVar5 >> 0x10;
    local_88[8] = local_88[8] + uVar3;
    uVar7 = uVar7 ^ local_88[8];
    uVar5 = uVar7 << 0xc | uVar7 >> 0x14;
    local_88[2] = local_88[2] + uVar5;
    uVar3 = uVar3 ^ local_88[2];
    local_88[0xd] = uVar3 << 8 | uVar3 >> 0x18;
    local_88[8] = local_88[8] + local_88[0xd];
    uVar5 = uVar5 ^ local_88[8];
    local_88[7] = uVar5 << 7 | uVar5 >> 0x19;
    local_88[3] = local_88[3] + uVar6;
    uVar9 = uVar9 ^ local_88[3];
    uVar5 = uVar9 << 0x10 | uVar9 >> 0x10;
    local_94 = local_94 + uVar5;
    uVar6 = uVar6 ^ local_94;
    uVar3 = uVar6 << 0xc | uVar6 >> 0x14;
    local_88[3] = local_88[3] + uVar3;
    uVar5 = uVar5 ^ local_88[3];
    local_88[0xe] = uVar5 << 8 | uVar5 >> 0x18;
    local_94 = local_94 + local_88[0xe];
    uVar3 = uVar3 ^ local_94;
    local_88[4] = uVar3 << 7 | uVar3 >> 0x19;
    local_8c = local_8c + 2;
  } while (local_8c < 0x12);
  local_88[1] = local_90;
  local_88[9] = local_94;
  lVar2 = 0;
  do {
    local_88[lVar2] = local_88[lVar2] + ctx->state[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  lVar2 = 0;
  do {
    *(uint *)(ctx->current + lVar2 * 4) = local_88[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  ctx->currentIndex = 0;
  local_38 = ctx;
  smemclr(local_88,0x40);
  puVar1 = ctx->state + 0xc;
  *puVar1 = *puVar1 + 1;
  if (*puVar1 == 0) {
    ctx->state[0xd] = ctx->state[0xd] + 1;
  }
  return;
}

Assistant:

static INLINE void chacha20_round(struct chacha20 *ctx)
{
    int i;
    uint32_t copy[16];

    /* Take a copy */
    memcpy(copy, ctx->state, sizeof(copy));

    /* A circular rotation for a 32bit number */
#define rotl(x, shift) x = ((x << shift) | (x >> (32 - shift)))

    /* What to do for each quarter round operation */
#define qrop(a, b, c, d)                        \
    copy[a] += copy[b];                         \
    copy[c] ^= copy[a];                         \
    rotl(copy[c], d)

    /* A quarter round */
#define quarter(a, b, c, d)                     \
    qrop(a, b, d, 16);                          \
    qrop(c, d, b, 12);                          \
    qrop(a, b, d, 8);                           \
    qrop(c, d, b, 7)

    /* Do 20 rounds, in pairs because every other is different */
    for (i = 0; i < 20; i += 2) {
        /* A round */
        quarter(0, 4, 8, 12);
        quarter(1, 5, 9, 13);
        quarter(2, 6, 10, 14);
        quarter(3, 7, 11, 15);
        /* Another slightly different round */
        quarter(0, 5, 10, 15);
        quarter(1, 6, 11, 12);
        quarter(2, 7, 8, 13);
        quarter(3, 4, 9, 14);
    }

    /* Dump the macros, don't need them littering */
#undef rotl
#undef qrop
#undef quarter

    /* Add the initial state */
    for (i = 0; i < 16; ++i) {
        copy[i] += ctx->state[i];
    }

    /* Update the content of the xor buffer */
    for (i = 0; i < 16; ++i) {
        ctx->current[i * 4 + 0] = copy[i] >> 0;
        ctx->current[i * 4 + 1] = copy[i] >> 8;
        ctx->current[i * 4 + 2] = copy[i] >> 16;
        ctx->current[i * 4 + 3] = copy[i] >> 24;
    }
    /* State full, reset pointer to beginning */
    ctx->currentIndex = 0;
    smemclr(copy, sizeof(copy));

    /* Increment round counter */
    ++ctx->state[12];
    /* Check for overflow, not done in one line so the 32 bits are chopped by the type */
    if (!(uint32_t)(ctx->state[12])) {
        ++ctx->state[13];
    }
}